

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O0

exr_result_t
validate_channels(_internal_exr_context *f,_internal_exr_part *curpart,exr_attr_chlist_t *channels)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  exr_result_t eVar4;
  long lVar5;
  long lVar6;
  int *in_RDX;
  long in_RSI;
  long in_RDI;
  int32_t ysamp;
  int32_t xsamp;
  int c;
  int64_t h;
  int64_t w;
  exr_attr_box2i_t dw;
  int local_44;
  int local_30;
  int iStack_2c;
  int local_28;
  int iStack_24;
  exr_result_t local_4;
  
  if (in_RDX == (int *)0x0) {
    local_4 = (**(code **)(in_RDI + 0x40))
                        (in_RDI,3,"Missing required channels attribute to validate against");
  }
  else if (*(long *)(in_RSI + 0x30) == 0) {
    local_4 = (**(code **)(in_RDI + 0x40))
                        (in_RDI,0xf,
                         "request to validate channel list, but data window not set to validate against"
                        );
  }
  else if (*in_RDX < 1) {
    local_4 = (**(code **)(in_RDI + 0x40))(in_RDI,6,"At least one channel required");
  }
  else {
    uVar3 = *(ulong *)(in_RSI + 0x90);
    local_28 = (int)*(undefined8 *)(in_RSI + 0x98);
    local_30 = (int)uVar3;
    lVar5 = ((long)local_28 - (long)local_30) + 1;
    iStack_24 = (int)((ulong)*(undefined8 *)(in_RSI + 0x98) >> 0x20);
    iStack_2c = (int)(uVar3 >> 0x20);
    lVar6 = ((long)iStack_24 - (long)iStack_2c) + 1;
    for (local_44 = 0; local_44 < *in_RDX; local_44 = local_44 + 1) {
      iVar1 = *(int *)(*(long *)(in_RDX + 2) + (long)local_44 * 0x20 + 0x18);
      iVar2 = *(int *)(*(long *)(in_RDX + 2) + (long)local_44 * 0x20 + 0x1c);
      if (iVar1 < 1) {
        eVar4 = (**(code **)(in_RDI + 0x48))
                          (in_RDI,0xe,"channel \'%s\': x subsampling factor is invalid (%d)",
                           *(undefined8 *)(*(long *)(in_RDX + 2) + (long)local_44 * 0x20 + 8),iVar1)
        ;
        return eVar4;
      }
      if (iVar2 < 1) {
        eVar4 = (**(code **)(in_RDI + 0x48))
                          (in_RDI,0xe,"channel \'%s\': y subsampling factor is invalid (%d)",
                           *(undefined8 *)(*(long *)(in_RDX + 2) + (long)local_44 * 0x20 + 8),iVar2)
        ;
        return eVar4;
      }
      if (local_30 % iVar1 != 0) {
        eVar4 = (**(code **)(in_RDI + 0x48))
                          (in_RDI,0xe,
                           "channel \'%s\': minimum x coordinate (%d) of the data window is not a multiple of the x subsampling factor (%d)"
                           ,*(undefined8 *)(*(long *)(in_RDX + 2) + (long)local_44 * 0x20 + 8),
                           uVar3 & 0xffffffff,iVar1);
        return eVar4;
      }
      if (iStack_2c % iVar2 != 0) {
        eVar4 = (**(code **)(in_RDI + 0x48))
                          (in_RDI,0xe,
                           "channel \'%s\': minimum y coordinate (%d) of the data window is not a multiple of the y subsampling factor (%d)"
                           ,*(undefined8 *)(*(long *)(in_RDX + 2) + (long)local_44 * 0x20 + 8),
                           iStack_2c,iVar2);
        return eVar4;
      }
      if (lVar5 % (long)iVar1 != 0) {
        eVar4 = (**(code **)(in_RDI + 0x48))
                          (in_RDI,0xe,
                           "channel \'%s\': row width (%ld) of the data window is not a multiple of the x subsampling factor (%d)"
                           ,*(undefined8 *)(*(long *)(in_RDX + 2) + (long)local_44 * 0x20 + 8),lVar5
                           ,iVar1);
        return eVar4;
      }
      if (lVar6 % (long)iVar2 != 0) {
        eVar4 = (**(code **)(in_RDI + 0x48))
                          (in_RDI,0xe,
                           "channel \'%s\': column height (%ld) of the data window is not a multiple of the y subsampling factor (%d)"
                           ,*(undefined8 *)(*(long *)(in_RDX + 2) + (long)local_44 * 0x20 + 8),lVar6
                           ,iVar2);
        return eVar4;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static exr_result_t
validate_channels (
    struct _internal_exr_context* f,
    struct _internal_exr_part*    curpart,
    const exr_attr_chlist_t*      channels)
{
    exr_attr_box2i_t dw;
    int64_t          w, h;

    if (!channels)
        return f->report_error (
            f,
            EXR_ERR_INVALID_ARGUMENT,
            "Missing required channels attribute to validate against");
    if (!curpart->dataWindow)
        return f->report_error (
            f,
            EXR_ERR_NO_ATTR_BY_NAME,
            "request to validate channel list, but data window not set to validate against");

    if (channels->num_channels <= 0)
        return f->report_error (
            f, EXR_ERR_FILE_BAD_HEADER, "At least one channel required");

    dw = curpart->data_window;
    w  = (int64_t) dw.max.x - (int64_t) dw.min.x + 1;
    h  = (int64_t) dw.max.y - (int64_t) dw.min.y + 1;

    for (int c = 0; c < channels->num_channels; ++c)
    {
        int32_t xsamp = channels->entries[c].x_sampling;
        int32_t ysamp = channels->entries[c].y_sampling;

        if (xsamp < 1)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': x subsampling factor is invalid (%d)",
                channels->entries[c].name.str,
                xsamp);
        if (ysamp < 1)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': y subsampling factor is invalid (%d)",
                channels->entries[c].name.str,
                ysamp);
        if (dw.min.x % xsamp)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': minimum x coordinate (%d) of the data window is not a multiple of the x subsampling factor (%d)",
                channels->entries[c].name.str,
                dw.min.x,
                xsamp);
        if (dw.min.y % ysamp)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': minimum y coordinate (%d) of the data window is not a multiple of the y subsampling factor (%d)",
                channels->entries[c].name.str,
                dw.min.y,
                ysamp);
        if (w % xsamp)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': row width (%" PRId64
                ") of the data window is not a multiple of the x subsampling factor (%d)",
                channels->entries[c].name.str,
                w,
                xsamp);
        if (h % ysamp)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': column height (%" PRId64
                ") of the data window is not a multiple of the y subsampling factor (%d)",
                channels->entries[c].name.str,
                h,
                ysamp);
    }

    return EXR_ERR_SUCCESS;
}